

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

char * lua_getlocal(lua_State *L,lua_Debug *ar,int n)

{
  long in_RSI;
  GCproto *in_RDI;
  TValue *o;
  char *name;
  char *local_50;
  undefined8 in_stack_ffffffffffffffd0;
  char **in_stack_ffffffffffffffd8;
  lua_Debug *in_stack_ffffffffffffffe0;
  lua_State *in_stack_ffffffffffffffe8;
  
  local_50 = (char *)0x0;
  if (in_RSI == 0) {
    if ((*(int *)(*(long *)&in_RDI->sizekgc + -4) == -9) &&
       (*(char *)((ulong)*(uint *)(*(long *)&in_RDI->sizekgc + -8) + 6) == '\0')) {
      local_50 = debug_varname(in_RDI,0,0);
    }
  }
  else {
    debug_localname(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                    (BCReg)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  }
  return local_50;
}

Assistant:

LUA_API const char *lua_getlocal(lua_State *L, const lua_Debug *ar, int n)
{
  const char *name = NULL;
  if (ar) {
    TValue *o = debug_localname(L, ar, &name, (BCReg)n);
    if (name) {
      copyTV(L, L->top, o);
      incr_top(L);
    }
  } else if (tvisfunc(L->top-1) && isluafunc(funcV(L->top-1))) {
    name = debug_varname(funcproto(funcV(L->top-1)), 0, (BCReg)n-1);
  }
  return name;
}